

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O1

float vkt::shaderexecutor::anon_unknown_0::makeFloatRepresentable(float f,Precision precision)

{
  int iVar1;
  uint uVar2;
  float fVar3;
  ulong uVar4;
  int iVar5;
  
  fVar3 = f;
  if (precision != PRECISION_HIGHP) {
    uVar4 = (ulong)precision;
    uVar2 = ~(-1 << ((&DAT_00b8730c)[uVar4 * 4] & 0x1f)) <<
            (0x17 - (&DAT_00b8730c)[uVar4 * 4] & 0x1f);
    if (precision == PRECISION_LOWP) {
      fVar3 = (float)(*(int *)(&DAT_00b878a8 + uVar4 * 4) * 0x800000 + 0x3f800001);
    }
    else {
      fVar3 = 0.0;
    }
    iVar5 = ((uint)f >> 0x17 & 0xff) - 0x7f;
    iVar1 = -0x7e;
    if (((uint)f & 0x7fffff) == 0) {
      iVar1 = iVar5;
    }
    if (((uint)f & 0x7f800000) != 0) {
      iVar1 = iVar5;
    }
    if (*(int *)(&DAT_00b878a8 + uVar4 * 4) <= iVar1) {
      if (*(int *)(&DAT_00b8789c + uVar4 * 4) < iVar1) {
        fVar3 = (float)(*(int *)(&DAT_00b8789c + uVar4 * 4) * 0x800000 + 0x3f800000U | uVar2);
        if ((int)f < 0) {
          return (float)((uint)fVar3 ^ (uint)DAT_00b06e70);
        }
      }
      else {
        fVar3 = (float)(iVar1 * 0x800000 + 0x3f800000U | (uint)f & 0x80000000 |
                       uVar2 & (uint)f & 0x7fffff);
      }
    }
  }
  return fVar3;
}

Assistant:

static float makeFloatRepresentable (float f, glu::Precision precision)
{
	if (precision == glu::PRECISION_HIGHP)
	{
		// \note: assuming f is not extended-precision
		return f;
	}
	else
	{
		const int			numMantissaBits				= getMinMantissaBits(precision);
		const int			maxNormalizedValueExponent	= getMaxNormalizedValueExponent(precision);
		const int			minNormalizedValueExponent	= getMinNormalizedValueExponent(precision);
		const deUint32		representableMantissaMask	= ((deUint32(1) << numMantissaBits) - 1) << (23 - (deUint32)numMantissaBits);
		const float			largestRepresentableValue	= tcu::Float32::constructBits(+1, maxNormalizedValueExponent, ((1u << numMantissaBits) - 1u) << (23u - (deUint32)numMantissaBits)).asFloat();
		const bool			zeroNotRepresentable		= (precision == glu::PRECISION_LOWP);

		// if zero is not required to be representable, use smallest positive non-subnormal value
		const float			zeroValue					= (zeroNotRepresentable) ? (tcu::Float32::constructBits(+1, minNormalizedValueExponent, 1).asFloat()) : (0.0f);

		const tcu::Float32	float32Representation		(f);

		if (float32Representation.exponent() < minNormalizedValueExponent)
		{
			// flush too small values to zero
			return zeroValue;
		}
		else if (float32Representation.exponent() > maxNormalizedValueExponent)
		{
			// clamp too large values
			return (float32Representation.sign() == +1) ? (largestRepresentableValue) : (-largestRepresentableValue);
		}
		else
		{
			// remove unrepresentable mantissa bits
			const tcu::Float32 targetRepresentation(tcu::Float32::constructBits(float32Representation.sign(),
													float32Representation.exponent(),
													float32Representation.mantissaBits() & representableMantissaMask));

			return targetRepresentation.asFloat();
		}
	}
}